

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O1

void k053260_alloc_rom(void *chip,UINT32 memsize)

{
  void *__s;
  uint uVar1;
  k053260_state *info;
  
  if (*(UINT32 *)((long)chip + 0xd0) == memsize) {
    return;
  }
  __s = realloc(*(void **)((long)chip + 200),(ulong)memsize);
  *(void **)((long)chip + 200) = __s;
  *(UINT32 *)((long)chip + 0xd0) = memsize;
  if (memsize == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = memsize - 1 >> 1 | memsize - 1;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    uVar1 = uVar1 >> 0x10 | uVar1;
  }
  *(uint *)((long)chip + 0xd4) = uVar1;
  memset(__s,0xff,(ulong)memsize);
  return;
}

Assistant:

static void k053260_alloc_rom(void* chip, UINT32 memsize)
{
	k053260_state *info = (k053260_state *)chip;
	
	if (info->rom_size == memsize)
		return;
	
	info->rom = (UINT8*)realloc(info->rom, memsize);
	info->rom_size = memsize;
	info->rom_mask = pow2_mask(memsize);
	memset(info->rom, 0xFF, memsize);
	
	return;
}